

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>::templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>>>>
::
emplace<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>
          (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>>>>
           *this,tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
                 *key,SystemSubroutine **args)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>::templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_bool>
  pVar2;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>::templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_bool>
  pVar3;
  bool local_51;
  templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>
  local_50;
  char local_41;
  EntryPointer psStack_40;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  SystemSubroutine **args_local;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> *key_local;
  sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
  *this_local;
  bool local_10;
  
  index = (size_t)args;
  args_local = (SystemSubroutine **)key;
  key_local = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
               *)this;
  hash = hash_object<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>
                   (this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x10),hash,*(size_t *)(this + 8));
  psStack_40 = (EntryPointer)(*(long *)this + (long)current_entry * 0x28);
  local_41 = '\0';
  do {
    if (psStack_40->distance_from_desired < local_41) {
      pVar2 = emplace_new_key<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>
                        (this,local_41,psStack_40,
                         (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
                          *)args_local,(SystemSubroutine **)index);
      local_10 = pVar2.second;
LAB_0037a116:
      this_local = (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
                    *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,slang::ast::SystemSubroutine_const*>>
                      (this,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
                             *)args_local,&(psStack_40->field_1).value);
    if (bVar1) {
      sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>
      ::
      templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>
      ::templated_iterator(&local_50,psStack_40);
      local_51 = false;
      std::
      pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>::templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_bool>
      ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>_>::templated_iterator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>,_bool>
                          *)&this_local,&local_50,&local_51);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_0037a116;
    }
    psStack_40 = psStack_40 + 1;
    local_41 = local_41 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }